

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::Secp256k1::CombinePubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *pubkey_list)

{
  void *pvVar1;
  uchar *puVar2;
  undefined8 uVar3;
  ByteData *this_00;
  int iVar4;
  value_type_conflict1 *__val;
  CfdException *pCVar5;
  size_type __n;
  pointer pBVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  secp256k1_pubkey combine_key;
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> key_array;
  size_t byte_size;
  vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_> ptr_array;
  undefined1 local_e8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  undefined1 local_b0 [64];
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> local_70;
  ByteData *local_58;
  size_type local_50;
  vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_> local_48;
  
  pvVar1 = this->secp256k1_context_;
  if (pvVar1 == (void *)0x0) {
    local_b0._0_8_ = "cfdcore_secp256k1.cpp";
    local_b0._8_4_ = 0x38;
    local_b0._16_8_ = "CombinePubkeySecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"Secp256k1 context is NULL.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0._0_8_ = local_b0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"Secp256k1 context is NULL.","");
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  __n = ((long)(pubkey_list->
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(pubkey_list->
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (__n < 2) {
    local_b0._0_8_ = "cfdcore_secp256k1.cpp";
    local_b0._8_4_ = 0x3e;
    local_b0._16_8_ = "CombinePubkeySecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"Invalid Argument pubkey list.")
    ;
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0._0_8_ = local_b0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"Invalid Pubkey List data.","");
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::vector
            (&local_70,__n,(allocator_type *)local_b0);
  local_58 = __return_storage_ptr__;
  ::std::vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>::vector
            (&local_48,
             ((long)(pubkey_list->
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pubkey_list->
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_b0);
  pBVar6 = (pubkey_list->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pubkey_list->super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
      _M_impl.super__Vector_impl_data._M_finish != pBVar6) {
    lVar7 = 0;
    lVar8 = 0;
    uVar9 = 0;
    do {
      puVar2 = (local_70.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                _M_impl.super__Vector_impl_data._M_start)->data;
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
                         (ByteData *)
                         ((long)&(pBVar6->data_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar7));
      uVar3 = local_b0._0_8_;
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
                         (ByteData *)
                         ((long)&(((pubkey_list->
                                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->data_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar7));
      iVar4 = secp256k1_ec_pubkey_parse
                        (pvVar1,puVar2 + lVar8,uVar3,
                         CONCAT44(local_e8._12_4_,local_e8._8_4_) - local_e8._0_8_);
      if ((pointer)local_e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_e8._0_8_);
      }
      if ((pointer)local_b0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_b0._0_8_);
      }
      if (iVar4 != 1) {
        local_b0._0_8_ = "cfdcore_secp256k1.cpp";
        local_b0._8_4_ = 0x4e;
        local_b0._16_8_ = "CombinePubkeySecp256k1Ec";
        logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,
                      "Secp256k1 pubkey parse Error.");
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_b0._0_8_ = local_b0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,"Secp256k1 pubkey parse Error.","");
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_b0);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_48.super__Vector_base<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] =
           (anon_struct_64_1_898a9ca8 *)
           ((local_70.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
             _M_impl.super__Vector_impl_data._M_start)->data + lVar8);
      uVar9 = uVar9 + 1;
      pBVar6 = (pubkey_list->
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x40;
      lVar7 = lVar7 + 0x18;
    } while (uVar9 < (ulong)(((long)(pubkey_list->
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6 >> 3)
                            * -0x5555555555555555));
  }
  iVar4 = secp256k1_ec_pubkey_combine
                    (pvVar1,local_b0,
                     local_48.
                     super__Vector_base<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_70.
                           super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_70.
                           super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 6);
  this_00 = local_58;
  if (iVar4 != 1) {
    local_e8._0_8_ = "cfdcore_secp256k1.cpp";
    local_e8._8_4_ = 0x5a;
    local_e8._16_8_ = "CombinePubkeySecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,
                  "Secp256k1 pubkey combine Error.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._0_8_ = local_e8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Secp256k1 pubkey combine Error.","");
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_e8);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x41);
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x41;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x30] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x31] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x32] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x33] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x34] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x35] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x36] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x37] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x38] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x39] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3a] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3b] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3c] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3d] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3e] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3f] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x24] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x25] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x26] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x27] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x28] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x29] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2a] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2b] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2c] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2d] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2e] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2f] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x40] = '\0';
  local_50 = 0x41;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  iVar4 = secp256k1_ec_pubkey_serialize
                    (pvVar1,local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,&local_50,local_b0,0x102);
  if (iVar4 == 1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,local_50);
    ByteData::ByteData(this_00,&local_c8);
    if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.
                      super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return this_00;
  }
  local_e8._0_8_ = "cfdcore_secp256k1.cpp";
  local_e8._8_4_ = 0x67;
  local_e8._16_8_ = "CombinePubkeySecp256k1Ec";
  logger::log<>((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,
                "Secp256k1 pubkey serialize Error.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8._0_8_ = local_e8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,"Secp256k1 pubkey serialize Error.","");
  CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_e8);
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Secp256k1::CombinePubkeySecp256k1Ec(
    const std::vector<ByteData>& pubkey_list) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }

  if (pubkey_list.size() < 2) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey list.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey List data.");
  }

  std::vector<secp256k1_pubkey> key_array(pubkey_list.size());
  std::vector<secp256k1_pubkey*> ptr_array(pubkey_list.size());
  int ret;

  for (size_t i = 0; i < pubkey_list.size(); ++i) {
    // Change ByteData to secp256k1_pubkey format
    ret = secp256k1_ec_pubkey_parse(
        context, &key_array[i], pubkey_list[i].GetBytes().data(),
        pubkey_list[i].GetBytes().size());

    if (ret != 1) {
      warn(CFD_LOG_SOURCE, "Secp256k1 pubkey parse Error.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
    }
    ptr_array[i] = &key_array[i];
  }

  // Join Pubkey
  secp256k1_pubkey combine_key;
  ret = secp256k1_ec_pubkey_combine(
      context, &combine_key, ptr_array.data(), key_array.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey combine Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey combine Error.");
  }

  std::vector<uint8_t> byte_data(65);
  size_t byte_size = byte_data.size();
  // Format ByteData
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &combine_key,
      SECP256K1_EC_COMPRESSED);

  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey serialize Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }

  byte_data.resize(byte_size);
  return ByteData(byte_data);
}